

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcAlarmType::~IfcAlarmType(IfcAlarmType *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)
   &this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x48 = 0x8f3db0;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x30 = 0x8f3ef0;
  this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
  super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.ptr.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x8f3dd8;
  *(pointer *)
   ((long)&this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
           super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.ptr + 0x10)
       = (pointer)(vtable + 0x68);
  *(undefined8 *)
   ((long)&this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
           super_IfcElementType.super_IfcTypeProduct.Tag.ptr.field_2 + 8) = 0x8f3e28;
  *(undefined8 *)
   &this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
    super_IfcElementType.field_0x190 = 0x8f3e50;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x8f3e78;
  *(undefined8 *)&this[-1].field_0x1d8 = 0x8f3ea0;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject = 0x8f3ec8;
  puVar1 = *(undefined1 **)
            &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x10;
  if (puVar1 != &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
                 super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x20) {
    operator_delete(puVar1);
  }
  puVar1 = &this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
            super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x48;
  *(undefined8 *)
   &this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x48 = 0x8f4350;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x30 = 0x8f4418;
  this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
  super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.ptr.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x8f4378;
  *(pointer *)
   ((long)&this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
           super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.ptr + 0x10)
       = (pointer)(IfcElementType-in-Assimp::IFC::Schema_2x3::IfcAlarmType::construction_vtable +
                  0x68);
  *(undefined8 *)
   ((long)&this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
           super_IfcElementType.super_IfcTypeProduct.Tag.ptr.field_2 + 8) = 0x8f43c8;
  *(undefined8 *)
   &this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
    super_IfcElementType.field_0x190 = 0x8f43f0;
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcDistributionControlElementType.super_IfcDistributionElementType.
             field_0x1a0;
  if (puVar2 != &this[-1].super_IfcDistributionControlElementType.field_0x1b0) {
    operator_delete(puVar2);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)puVar1,&PTR_construction_vtable_24__008f3f20);
  operator_delete(puVar1);
  return;
}

Assistant:

IfcAlarmType() : Object("IfcAlarmType") {}